

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.cpp
# Opt level: O3

void __thiscall zmq::dist_t::reverse_match(dist_t *this)

{
  ulong uVar1;
  ulong uVar2;
  pointer pppVar3;
  pipe_t *ppVar4;
  pipe_t *ppVar5;
  long lVar6;
  
  uVar1 = this->_matching;
  uVar2 = this->_eligible;
  this->_matching = 0;
  if (uVar1 <= uVar2 && uVar2 - uVar1 != 0) {
    lVar6 = 0;
    do {
      pppVar3 = (this->_pipes)._items.
                super__Vector_base<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar4 = pppVar3[uVar1 + lVar6];
      if (ppVar4 != (pipe_t *)0x0) {
        *(int *)((long)&ppVar4->super_array_item_t<2> + 8) = (int)lVar6;
      }
      ppVar5 = pppVar3[lVar6];
      if (ppVar5 != (pipe_t *)0x0) {
        *(int *)((long)&ppVar5->super_array_item_t<2> + 8) = (int)uVar1 + (int)lVar6;
      }
      pppVar3[uVar1 + lVar6] = ppVar5;
      pppVar3[lVar6] = ppVar4;
      lVar6 = lVar6 + 1;
    } while ((uVar1 - uVar2) + lVar6 != 0);
    this->_matching = uVar2 - uVar1;
  }
  return;
}

Assistant:

void zmq::dist_t::reverse_match ()
{
    const pipes_t::size_type prev_matching = _matching;

    // Reset matching to 0
    unmatch ();

    // Mark all matching pipes as not matching and vice-versa.
    // To do this, push all pipes that are eligible but not
    // matched - i.e. between "matching" and "eligible" -
    // to the beginning of the queue.
    for (pipes_t::size_type i = prev_matching; i < _eligible; ++i) {
        _pipes.swap (i, _matching++);
    }
}